

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void google::protobuf::compiler::cpp::GatherAllCustomOptionTypes
               (FileDescriptor *file,
               btree_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>_>
               *out)

{
  initializer_list<const_google::protobuf::Message_*> __l;
  int iVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  DescriptorPool *pDVar5;
  Descriptor *pDVar6;
  DescriptorStringView psVar7;
  long lVar8;
  Message *pMVar9;
  pointer pMVar10;
  LogMessage *pLVar11;
  reference ppMVar12;
  Reflection *pRVar13;
  reference ppFVar14;
  mapped_type *ppDVar15;
  undefined1 auVar16 [16];
  value_type local_278;
  value_type local_270;
  int local_264;
  Descriptor *pDStack_260;
  int i;
  Descriptor *field_msg;
  Descriptor *desc;
  FieldDescriptor *field;
  iterator __end4;
  iterator __begin4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range4;
  Reflection *reflection;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Message *msg;
  pointer local_200;
  iterator local_1f8;
  size_type local_1f0;
  undefined1 local_1e8 [8];
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  to_process;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  LogMessageFatal local_1b8 [23];
  Voidify local_1a1;
  string local_1a0 [32];
  undefined1 local_180 [16];
  FileDescriptorProto local_170 [8];
  FileDescriptorProto linkedin_fd_proto;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> local_80;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> fd_proto;
  DynamicMessageFactory factory;
  Descriptor *fd_proto_descriptor;
  DescriptorPool *pool;
  btree_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  *out_local;
  FileDescriptor *file_local;
  
  pDVar5 = FileDescriptor::pool(file);
  pDVar6 = FileDescriptorProto::descriptor();
  psVar7 = Descriptor::full_name_abi_cxx11_(pDVar6);
  auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
  lVar8 = google::protobuf::DescriptorPool::FindMessageTypeByName
                    (pDVar5,auVar16._0_8_,auVar16._8_8_);
  if (lVar8 != 0) {
    google::protobuf::DynamicMessageFactory::DynamicMessageFactory
              ((DynamicMessageFactory *)&fd_proto,pDVar5);
    pMVar9 = (Message *)
             google::protobuf::DynamicMessageFactory::GetPrototype((Descriptor *)&fd_proto);
    pMVar9 = Message::New(pMVar9);
    std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
    unique_ptr<std::default_delete<google::protobuf::Message>,void>
              ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>
                *)&local_80,pMVar9);
    FileDescriptorProto::FileDescriptorProto(local_170);
    google::protobuf::FileDescriptor::CopyTo((FileDescriptorProto *)file);
    pMVar10 = std::
              unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
              ::operator->(&local_80);
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    google::protobuf::MessageLite::SerializeAsString_abi_cxx11_();
    local_180 = std::__cxx11::string::operator_cast_to_basic_string_view(local_1a0);
    bVar2 = google::protobuf::MessageLite::ParseFromString(pMVar10,local_180._0_8_,local_180._8_8_);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1c8,"fd_proto->ParseFromString(linkedin_fd_proto.SerializeAsString())");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/file.cc"
                 ,0x42e,local_1c8._M_len,local_1c8._M_str);
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      pLVar11 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                          ((LogMessage *)local_1b8);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_1a1,pLVar11);
    }
    if ((to_process.
         super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_1b8);
    }
    std::__cxx11::string::~string(local_1a0);
    google::protobuf::FileDescriptorProto::~FileDescriptorProto(local_170);
    local_200 = std::
                unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                ::get(&local_80);
    local_1f8 = &local_200;
    local_1f0 = 1;
    std::allocator<const_google::protobuf::Message_*>::allocator
              ((allocator<const_google::protobuf::Message_*> *)((long)&msg + 7));
    __l._M_len = local_1f0;
    __l._M_array = local_1f8;
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            *)local_1e8,__l,(allocator<const_google::protobuf::Message_*> *)((long)&msg + 7));
    std::allocator<const_google::protobuf::Message_*>::~allocator
              ((allocator<const_google::protobuf::Message_*> *)((long)&msg + 7));
    while( true ) {
      bVar3 = std::
              vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
              ::empty((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                       *)local_1e8);
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      ppMVar12 = std::
                 vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                 ::back((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                         *)local_1e8);
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppMVar12;
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::pop_back((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  *)local_1e8);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&reflection);
      pRVar13 = Message::GetReflection
                          ((Message *)
                           fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      google::protobuf::Reflection::ListFields
                ((Message *)pRVar13,
                 (vector *)
                 fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end4 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)&reflection);
      field = (FieldDescriptor *)
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)&reflection);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end4,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                    *)&field);
        if (!bVar3) break;
        ppFVar14 = __gnu_cxx::
                   __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                   ::operator*(&__end4);
        desc = (Descriptor *)*ppFVar14;
        bVar3 = FieldDescriptor::is_extension((FieldDescriptor *)desc);
        if (bVar3) {
          pDVar6 = Message::GetDescriptor
                             ((Message *)
                              fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          field_msg = pDVar6;
          psVar7 = Descriptor::full_name_abi_cxx11_(pDVar6);
          ppDVar15 = absl::lts_20240722::container_internal::
                     btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                     ::operator[]<std::__cxx11::string>
                               ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                 *)out,psVar7);
          *ppDVar15 = pDVar6;
        }
        pDStack_260 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
        if (pDStack_260 != (Descriptor *)0x0) {
          bVar3 = FieldDescriptor::is_extension((FieldDescriptor *)desc);
          pDVar6 = pDStack_260;
          if (bVar3) {
            psVar7 = Descriptor::full_name_abi_cxx11_(pDStack_260);
            ppDVar15 = absl::lts_20240722::container_internal::
                       btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                       ::operator[]<std::__cxx11::string>
                                 ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                   *)out,psVar7);
            *ppDVar15 = pDVar6;
          }
          bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)desc);
          if (bVar3) {
            local_264 = 0;
            while( true ) {
              iVar1 = local_264;
              iVar4 = google::protobuf::Reflection::FieldSize
                                ((Message *)pRVar13,
                                 (FieldDescriptor *)
                                 fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (iVar4 <= iVar1) break;
              local_270 = (value_type)
                          google::protobuf::Reflection::GetRepeatedMessage
                                    ((Message *)pRVar13,
                                     (FieldDescriptor *)
                                     fields.
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(int)desc);
              std::
              vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
              ::push_back((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                           *)local_1e8,&local_270);
              local_264 = local_264 + 1;
            }
          }
          else {
            local_278 = (value_type)
                        google::protobuf::Reflection::GetMessage
                                  ((Message *)pRVar13,
                                   (FieldDescriptor *)
                                   fields.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (MessageFactory *)desc);
            std::
            vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ::push_back((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                         *)local_1e8,&local_278);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
        ::operator++(&__end4);
      }
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)&reflection);
    }
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    ~vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             *)local_1e8);
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    ~unique_ptr(&local_80);
    google::protobuf::DynamicMessageFactory::~DynamicMessageFactory
              ((DynamicMessageFactory *)&fd_proto);
  }
  return;
}

Assistant:

static void GatherAllCustomOptionTypes(
    const FileDescriptor* file,
    absl::btree_map<absl::string_view, const Descriptor*>& out) {
  const DescriptorPool* pool = file->pool();
  const Descriptor* fd_proto_descriptor = pool->FindMessageTypeByName(
      FileDescriptorProto::descriptor()->full_name());
  // Not all pools have descriptor.proto in them. In these cases there for sure
  // are no custom options.
  if (fd_proto_descriptor == nullptr) {
    return;
  }

  // It's easier to inspect file as a proto, because we can use reflection on
  // the proto to iterate over all content.
  // However, we can't use the generated proto linked into the proto compiler
  // for this, since it doesn't know the extensions that are potentially present
  // the protos that are being compiled.
  // Use a dynamic one from the correct pool to parse them.
  DynamicMessageFactory factory(pool);
  std::unique_ptr<Message> fd_proto(
      factory.GetPrototype(fd_proto_descriptor)->New());

  {
    FileDescriptorProto linkedin_fd_proto;
    file->CopyTo(&linkedin_fd_proto);
    ABSL_CHECK(
        fd_proto->ParseFromString(linkedin_fd_proto.SerializeAsString()));
  }

  // Now find all the messages used, recursively.
  std::vector<const Message*> to_process = {fd_proto.get()};
  while (!to_process.empty()) {
    const Message& msg = *to_process.back();
    to_process.pop_back();

    std::vector<const FieldDescriptor*> fields;
    const Reflection& reflection = *msg.GetReflection();
    reflection.ListFields(msg, &fields);

    for (auto* field : fields) {
      if (field->is_extension()) {
        // Always add the extended.
        const Descriptor* desc = msg.GetDescriptor();
        out[desc->full_name()] = desc;
      }

      // Add and recurse of the extendee if it is a message.
      const auto* field_msg = field->message_type();
      if (field_msg == nullptr) continue;
      if (field->is_extension()) {
        out[field_msg->full_name()] = field_msg;
      }
      if (field->is_repeated()) {
        for (int i = 0; i < reflection.FieldSize(msg, field); i++) {
          to_process.push_back(&reflection.GetRepeatedMessage(msg, field, i));
        }
      } else {
        to_process.push_back(&reflection.GetMessage(msg, field));
      }
    }
  }
}